

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O0

int ndn_hmac_sha256(void *payload,uint32_t payload_length,ndn_hmac_key_t *hmac_key,
                   uint8_t *hmac_result)

{
  int iVar1;
  undefined1 local_120 [8];
  ndn_hmac_sha256_state_t s;
  uint8_t *hmac_result_local;
  ndn_hmac_key_t *hmac_key_local;
  uint32_t payload_length_local;
  void *payload_local;
  
  s.abs_state.s.key._120_8_ = hmac_result;
  iVar1 = ndn_hmac_sha256_init((ndn_hmac_sha256_state_t *)local_120,hmac_key);
  if (iVar1 == 0) {
    iVar1 = ndn_hmac_sha256_update((ndn_hmac_sha256_state_t *)local_120,payload,payload_length);
    if (iVar1 == 0) {
      iVar1 = ndn_hmac_sha256_final
                        ((ndn_hmac_sha256_state_t *)local_120,(uint8_t *)s.abs_state.s.key._120_8_);
      if (iVar1 == 0) {
        payload_local._4_4_ = 0;
      }
      else {
        payload_local._4_4_ = -0x19;
      }
    }
    else {
      payload_local._4_4_ = -0x19;
    }
  }
  else {
    payload_local._4_4_ = -0x19;
  }
  return payload_local._4_4_;
}

Assistant:

int
ndn_hmac_sha256(const void* payload, uint32_t payload_length,
                const ndn_hmac_key_t* hmac_key, uint8_t* hmac_result)
{
  ndn_hmac_sha256_state_t s;
  if (ndn_hmac_sha256_init(&s, hmac_key) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  if (ndn_hmac_sha256_update(&s, payload, payload_length) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  if (ndn_hmac_sha256_final(&s, hmac_result) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  return NDN_SUCCESS;
}